

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O1

Var __thiscall BailoutConstantValue::ToVar(BailoutConstantValue *this,Func *func)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  anon_union_8_3_5e50e90d_for_u aVar5;
  Var pvVar6;
  
  IVar1 = this->type;
  if ((IVar1 != TyFloat64) && (IVar1 != TyVar)) {
    bVar3 = IRType_IsSignedInt(IVar1);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x25,
                         "(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type))"
                         ,
                         "this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type)"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  IVar1 = this->type;
  if (IVar1 != TyFloat64) {
    if (IVar1 == TyVar) {
      aVar5 = this->u;
    }
    else {
      bVar3 = IRType_IsSignedInt(IVar1);
      if ((!bVar3) || (4 < TySize[this->type])) {
        aVar5 = (anon_union_8_3_5e50e90d_for_u)(double)(long)this->u;
        goto LAB_00560fd6;
      }
      aVar5 = (anon_union_8_3_5e50e90d_for_u)((ulong)*(uint *)&this->u | 0x1000000000000);
    }
    return (Var)aVar5;
  }
  aVar5 = this->u;
LAB_00560fd6:
  pvVar6 = Func::AllocateNumber(func,(double)aVar5);
  return pvVar6;
}

Assistant:

Js::Var BailoutConstantValue::ToVar(Func* func) const
{
    Assert(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type));
    Js::Var varValue;
    if (this->type == TyVar)
    {
        varValue = this->u.varConst.value;
    }
    else if (this->type == TyFloat64)
    {
        varValue = func->AllocateNumber((double)this->u.floatConst.value);
    }
    else if (IRType_IsSignedInt(this->type) && TySize[this->type] <= 4 && !Js::TaggedInt::IsOverflow((int32)this->u.intConst.value))
    {
        varValue = Js::TaggedInt::ToVarUnchecked((int32)this->u.intConst.value);
    }
    else
    {
        varValue = func->AllocateNumber((double)this->u.intConst.value);
    }
    return varValue;

}